

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Read<int> __thiscall
Omega_h::map_onto<int>(Omega_h *this,Read<int> *a_data,LOs *a2b,LO nb,int init_val,Int width)

{
  undefined8 uVar1;
  undefined8 uVar2;
  void *extraout_RDX;
  Read<int> RVar3;
  Write<int> local_1a0;
  Write<int> local_190;
  Read<int> local_180;
  Read<int> local_170;
  __cxx11 local_160 [32];
  __cxx11 local_140 [55];
  allocator local_109;
  string local_108 [32];
  undefined1 local_e8 [8];
  Write<int> out;
  Int width_local;
  int init_val_local;
  LO nb_local;
  LOs *a2b_local;
  Read<int> *a_data_local;
  ulong local_60;
  ulong local_50;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  out.shared_alloc_.direct_ptr._4_4_ = width;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"",&local_109);
  Write<int>::Write((Write<int> *)local_e8,nb * width,init_val,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  if (((ulong)local_e8 & 1) == 0) {
    local_60 = *(size_t *)local_e8;
  }
  else {
    local_60 = (ulong)local_e8 >> 3;
  }
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_60 >> 2) < (int)(local_10 >> 2)) {
    if (((ulong)local_e8 & 1) == 0) {
      local_50 = *(size_t *)local_e8;
    }
    else {
      local_50 = (ulong)local_e8 >> 3;
    }
    std::__cxx11::to_string(local_140,(int)(local_50 >> 2));
    uVar1 = std::__cxx11::string::c_str();
    if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
      local_20 = ((a_data->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_20 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
    }
    std::__cxx11::to_string(local_160,(int)(local_20 >> 2));
    uVar2 = std::__cxx11::string::c_str();
    printf("ERROR: !( %s %s %s ) : ! ( %s %s %s )\n","out.size()",">=","a_data.size()",uVar1,">=",
           uVar2);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_140);
  }
  if (((ulong)local_e8 & 1) == 0) {
    local_40 = *(size_t *)local_e8;
  }
  else {
    local_40 = (ulong)local_e8 >> 3;
  }
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_30 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_30 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_30 >> 2) <= (int)(local_40 >> 2)) {
    Read<int>::Read(&local_170,a_data);
    Read<int>::Read(&local_180,a2b);
    Write<int>::Write(&local_190,(Write<int> *)local_e8);
    map_into<int>(&local_170,&local_180,&local_190,out.shared_alloc_.direct_ptr._4_4_);
    Write<int>::~Write(&local_190);
    Read<int>::~Read(&local_180);
    Read<int>::~Read(&local_170);
    Write<int>::Write(&local_1a0,(Write<int> *)local_e8);
    Read<int>::Read((Read<int> *)this,&local_1a0);
    Write<int>::~Write(&local_1a0);
    Write<int>::~Write((Write<int> *)local_e8);
    RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<int>)RVar3.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","(out.size()) >= (a_data.size())",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x45);
}

Assistant:

Read<T> map_onto(Read<T> a_data, LOs a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  OMEGA_H_CHECK_OP(out.size(), >=, a_data.size());
  map_into(a_data, a2b, out, width);
  return out;
}